

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# covscript.cpp
# Opt level: O3

numeric * cs::parse_number(numeric *__return_storage_ptr__,string *str)

{
  char *__nptr;
  long lVar1;
  int *piVar2;
  longlong lVar3;
  long *plVar4;
  int iVar5;
  unkbyte10 in_ST0;
  unkbyte10 in_ST1;
  undefined1 auVar6 [12];
  uint *local_50;
  long local_48;
  uint local_40;
  undefined4 uStack_3c;
  undefined4 uStack_38;
  undefined4 uStack_34;
  char *local_30;
  
  lVar1 = std::__cxx11::string::find((char)str,0x2e);
  __nptr = (str->_M_dataplus)._M_p;
  piVar2 = __errno_location();
  if (lVar1 == -1) {
LAB_00177992:
    iVar5 = *piVar2;
    *piVar2 = 0;
    lVar3 = strtoll(__nptr,&local_30,10);
    if (local_30 == __nptr) {
LAB_00177a00:
      auVar6 = std::__throw_invalid_argument("stoll");
      if (*piVar2 == 0) {
        *piVar2 = iVar5;
      }
      if (auVar6._8_4_ == 1) {
        __cxa_begin_catch(auVar6._0_8_);
        plVar4 = (long *)__cxa_allocate_exception(0x20);
        local_50 = &local_40;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_50,"Wrong literal format.","");
        *plVar4 = (long)(plVar4 + 2);
        if (local_50 == &local_40) {
          *(uint *)(plVar4 + 2) = local_40;
          *(undefined4 *)((long)plVar4 + 0x14) = uStack_3c;
          *(undefined4 *)(plVar4 + 3) = uStack_38;
          *(undefined4 *)((long)plVar4 + 0x1c) = uStack_34;
        }
        else {
          *plVar4 = (long)local_50;
          plVar4[2] = CONCAT44(uStack_3c,local_40);
        }
        plVar4[1] = local_48;
        local_48 = 0;
        local_40 = local_40 & 0xffffff00;
        local_50 = &local_40;
        __cxa_throw(plVar4,&lang_error::typeinfo,lang_error::~lang_error);
      }
      _Unwind_Resume(auVar6._0_8_);
    }
    if (*piVar2 == 0) {
      *piVar2 = iVar5;
    }
    else if (*piVar2 == 0x22) {
      std::__throw_out_of_range("stoll");
      goto LAB_001779cc;
    }
    __return_storage_ptr__->type = true;
    (__return_storage_ptr__->data)._int = lVar3;
  }
  else {
    iVar5 = *piVar2;
    *piVar2 = 0;
    strtold(__nptr,&local_30);
    if (local_30 == __nptr) {
      std::__throw_invalid_argument("stold");
      goto LAB_00177a00;
    }
    if (*piVar2 == 0) {
LAB_001779cc:
      *piVar2 = iVar5;
    }
    else if (*piVar2 == 0x22) {
      std::__throw_out_of_range("stold");
      in_ST0 = in_ST1;
      goto LAB_00177992;
    }
    __return_storage_ptr__->type = false;
    *(unkbyte10 *)&__return_storage_ptr__->data = in_ST0;
  }
  return __return_storage_ptr__;
}

Assistant:

numeric parse_number(const std::string &str)
	{
		try {
			if (str.find('.') != std::string::npos)
				return std::stold(str);
			else
				return std::stoll(str);
		}
		catch (const std::exception &e) {
			throw lang_error("Wrong literal format.");
		}
	}